

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

xmlChar * xmlDictLookup(xmlDictPtr dict,xmlChar *name,int len)

{
  xmlDictStringsPtr_conflict *ppxVar1;
  _xmlDict *p_Var2;
  _xmlDictEntry *p_Var3;
  xmlChar *pxVar4;
  int iVar5;
  uint32_t uVar6;
  size_t sVar7;
  unsigned_long uVar8;
  ulong uVar9;
  xmlDictStringsPtr_conflict pxVar10;
  _xmlDictEntry *p_Var11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  xmlChar *pxVar16;
  uint namelen;
  ulong __n;
  _xmlDictEntry *p_Var17;
  ulong uVar18;
  
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    sVar7 = (size_t)(uint)len;
    if (len < 0) {
      sVar7 = strlen((char *)name);
    }
    uVar15 = dict->limit;
    namelen = (uint)sVar7;
    __n = sVar7 & 0xffffffff;
    if (uVar15 == 0) {
      if (0x3fffffff < namelen) {
        return (xmlChar *)0x0;
      }
    }
    else if (0x3fffffff < namelen || uVar15 <= __n) {
      return (xmlChar *)0x0;
    }
    uVar12 = dict->size;
    if (uVar12 == 0x80) {
      uVar8 = xmlDictComputeFastKey(name,namelen,dict->seed);
    }
    else {
      uVar6 = xmlDictComputeBigKey(name,namelen,dict->seed);
      uVar8 = (unsigned_long)uVar6;
    }
    uVar18 = 0;
    uVar14 = uVar8 % uVar12;
    if (dict->dict[uVar14].valid == 0) {
      p_Var17 = (_xmlDictEntry *)0x0;
    }
    else {
      uVar18 = 0;
      p_Var17 = dict->dict + uVar14;
      while( true ) {
        p_Var11 = p_Var17->next;
        if (p_Var11 == (_xmlDictEntry *)0x0) break;
        if ((p_Var17->okey == uVar8) && (p_Var17->len == namelen)) {
          pxVar16 = p_Var17->name;
          iVar5 = bcmp(pxVar16,name,__n);
          if (iVar5 == 0) {
            return pxVar16;
          }
        }
        uVar18 = uVar18 + 1;
        p_Var17 = p_Var11;
      }
      if ((p_Var17->okey == uVar8) && (p_Var17->len == namelen)) {
        pxVar16 = p_Var17->name;
        iVar5 = bcmp(pxVar16,name,__n);
        if (iVar5 == 0) {
          return pxVar16;
        }
      }
    }
    p_Var2 = dict->subdict;
    if (p_Var2 != (_xmlDict *)0x0) {
      uVar13 = p_Var2->size;
      uVar9 = uVar8;
      if (uVar12 == 0x80) {
        uVar12 = 0x80;
        if (uVar13 != 0x80) {
          uVar6 = xmlDictComputeBigKey(name,namelen,p_Var2->seed);
          uVar12 = uVar13;
          uVar9 = (ulong)uVar6;
        }
      }
      else {
        uVar12 = uVar13;
        if (uVar13 == 0x80) {
          uVar9 = xmlDictComputeFastKey(name,namelen,p_Var2->seed);
          uVar12 = 0x80;
        }
      }
      if (p_Var2->dict[uVar9 % uVar12].valid != 0) {
        p_Var11 = p_Var2->dict + uVar9 % uVar12;
        while( true ) {
          p_Var3 = p_Var11->next;
          if (p_Var3 == (_xmlDictEntry *)0x0) break;
          if ((p_Var11->okey == uVar9) && (p_Var11->len == namelen)) {
            pxVar16 = p_Var11->name;
            iVar5 = bcmp(pxVar16,name,__n);
            if (iVar5 == 0) {
              return pxVar16;
            }
          }
          uVar18 = uVar18 + 1;
          p_Var11 = p_Var3;
        }
        if ((p_Var11->okey == uVar9) && (p_Var11->len == namelen)) {
          pxVar16 = p_Var11->name;
          iVar5 = bcmp(pxVar16,name,__n);
          if (iVar5 == 0) {
            return pxVar16;
          }
        }
      }
    }
    ppxVar1 = &dict->strings;
    uVar12 = 0;
    uVar13 = 0;
    pxVar10 = (xmlDictStringsPtr_conflict)ppxVar1;
    while (pxVar10 = pxVar10->next, pxVar10 != (xmlDictStringsPtr_conflict)0x0) {
      pxVar16 = pxVar10->free;
      if (__n < (ulong)((long)pxVar10->end - (long)pxVar16)) goto LAB_00141184;
      uVar9 = pxVar10->size;
      if (uVar12 < uVar9) {
        uVar12 = uVar9;
      }
      uVar13 = uVar13 + uVar9;
    }
    if ((uVar15 == 0) || (uVar13 <= uVar15)) {
      uVar15 = 1000;
      if (uVar12 != 0) {
        uVar15 = uVar12 * 4;
      }
      if (uVar15 <= namelen * 4) {
        uVar15 = (ulong)(namelen * 4);
      }
      pxVar10 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar15 + 0x30);
      if (pxVar10 != (xmlDictStringsPtr_conflict)0x0) {
        pxVar10->size = uVar15;
        pxVar10->nbStrings = 0;
        pxVar16 = pxVar10->array;
        pxVar10->free = pxVar16;
        pxVar10->end = pxVar10->array + uVar15;
        pxVar10->next = *ppxVar1;
        *ppxVar1 = pxVar10;
LAB_00141184:
        memcpy(pxVar16,name,__n);
        pxVar4 = pxVar10->free;
        pxVar10->free = pxVar4 + __n + 1;
        pxVar4[__n] = '\0';
        pxVar10->nbStrings = pxVar10->nbStrings + 1;
        if (pxVar16 != (xmlChar *)0x0) {
          if (p_Var17 == (_xmlDictEntry *)0x0) {
            p_Var11 = dict->dict + uVar14;
          }
          else {
            p_Var11 = (_xmlDictEntry *)(*xmlMalloc)(0x20);
            if (p_Var11 == (_xmlDictEntry *)0x0) {
              return (xmlChar *)0x0;
            }
          }
          p_Var11->next = (_xmlDictEntry *)0x0;
          p_Var11->name = pxVar16;
          p_Var11->len = namelen;
          p_Var11->valid = 1;
          p_Var11->okey = uVar8;
          if (p_Var17 != (_xmlDictEntry *)0x0) {
            p_Var17->next = p_Var11;
          }
          dict->nbElems = dict->nbElems + 1;
          if (uVar18 < 4) {
            return pxVar16;
          }
          if (0xaaa < dict->size) {
            return pxVar16;
          }
          iVar5 = xmlDictGrow(dict,dict->size * 6);
          if (iVar5 == 0) {
            return pxVar16;
          }
        }
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlDictLookup(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey, nbi = 0;
    xmlDictEntryPtr entry;
    xmlDictEntryPtr insert;
    const xmlChar *ret;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;

    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	    nbi++;
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
		nbi++;
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
	key = okey % dict->size;
    }

    ret = xmlDictAddString(dict, name, l);
    if (ret == NULL)
        return(NULL);
    if (insert == NULL) {
	entry = &(dict->dict[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlDictEntry));
	if (entry == NULL)
	     return(NULL);
    }
    entry->name = ret;
    entry->len = l;
    entry->next = NULL;
    entry->valid = 1;
    entry->okey = okey;


    if (insert != NULL)
	insert->next = entry;

    dict->nbElems++;

    if ((nbi > MAX_HASH_LEN) &&
        (dict->size <= ((MAX_DICT_HASH / 2) / MAX_HASH_LEN))) {
	if (xmlDictGrow(dict, MAX_HASH_LEN * 2 * dict->size) != 0)
	    return(NULL);
    }
    /* Note that entry may have been freed at this point by xmlDictGrow */

    return(ret);
}